

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::(anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,uint128 v,fmtflags flags)

{
  long lVar1;
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  uint128 v_03;
  uint128 v_04;
  uint128 v_05;
  uint128 divisor;
  uint128 dividend;
  uint128 divisor_00;
  uint128 dividend_00;
  _Setfill<char> _Var2;
  _Ios_Fmtflags _Var3;
  _Ios_Fmtflags __fmtfl;
  _Setw _Var4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  ostream *poVar8;
  undefined1 auStack_238 [8];
  uint128 mid;
  undefined1 auStack_208 [8];
  uint128 low;
  uint128 high;
  long lStack_1c8;
  fmtflags copy_mask;
  ostringstream os;
  int local_4c;
  undefined1 auStack_48 [4];
  int div_base_log;
  uint128 div;
  fmtflags flags_local;
  uint128 v_local;
  
  uVar6 = v.lo_;
  _Var3 = std::operator&((_Ios_Fmtflags)v.hi_,_S_basefield);
  if (_Var3 == _S_hex) {
    uint128::operator=((uint128 *)auStack_48,0x1000000000000000);
    local_4c = 0xf;
  }
  else if (_Var3 == _S_oct) {
    uint128::operator=((uint128 *)auStack_48,0x8000000000000000);
    local_4c = 0x15;
  }
  else {
    uint128::operator=((uint128 *)auStack_48,10000000000000000000);
    local_4c = 0x13;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe38);
  _Var3 = std::operator|(_S_basefield,_S_showbase);
  _Var3 = std::operator|(_Var3,_S_uppercase);
  lVar1 = *(long *)(lStack_1c8 + -0x18);
  __fmtfl = std::operator&((_Ios_Fmtflags)v.hi_,_Var3);
  std::ios_base::setf((ios_base *)((long)&stack0xfffffffffffffe38 + lVar1),__fmtfl,_Var3);
  mid.hi_ = _auStack_48;
  dividend_00.hi_ = uVar6;
  dividend_00.lo_ = (uint64_t)this;
  divisor_00.hi_ = div.lo_;
  divisor_00.lo_ = _auStack_48;
  low.hi_ = (uint64_t)this;
  anon_unknown_2::DivModImpl(dividend_00,divisor_00,(uint128 *)&low.hi_,(uint128 *)auStack_208);
  dividend.hi_ = uVar6;
  dividend.lo_ = low.hi_;
  divisor.hi_ = div.lo_;
  divisor.lo_ = _auStack_48;
  anon_unknown_2::DivModImpl(dividend,divisor,(uint128 *)&low.hi_,(uint128 *)auStack_238);
  v_05.hi_ = uVar6;
  v_05.lo_ = low.hi_;
  uVar5 = Uint128Low64(v_05);
  if (uVar5 == 0) {
    v_02.hi_ = mid.lo_;
    v_02.lo_ = (uint64_t)auStack_238;
    uVar6 = Uint128Low64(v_02);
    if (uVar6 != 0) {
      v_01.hi_ = mid.lo_;
      v_01.lo_ = (uint64_t)auStack_238;
      uVar6 = Uint128Low64(v_01);
      std::ostream::operator<<(&stack0xfffffffffffffe38,uVar6);
      uVar7 = std::ostream::operator<<(&stack0xfffffffffffffe38,std::noshowbase);
      _Var2 = std::setfill<char>('0');
      poVar8 = std::operator<<(uVar7,_Var2._M_c);
      _Var4 = std::setw(local_4c);
      std::operator<<(poVar8,_Var4);
    }
  }
  else {
    v_04.hi_ = uVar6;
    v_04.lo_ = low.hi_;
    uVar6 = Uint128Low64(v_04);
    std::ostream::operator<<(&stack0xfffffffffffffe38,uVar6);
    uVar7 = std::ostream::operator<<(&stack0xfffffffffffffe38,std::noshowbase);
    _Var2 = std::setfill<char>('0');
    poVar8 = std::operator<<(uVar7,_Var2._M_c);
    _Var4 = std::setw(local_4c);
    std::operator<<(poVar8,_Var4);
    v_03.hi_ = mid.lo_;
    v_03.lo_ = (uint64_t)auStack_238;
    uVar6 = Uint128Low64(v_03);
    std::ostream::operator<<(&stack0xfffffffffffffe38,uVar6);
    _Var4 = std::setw(local_4c);
    std::operator<<((ostream *)&stack0xfffffffffffffe38,_Var4);
  }
  v_00.hi_ = low.lo_;
  v_00.lo_ = (uint64_t)auStack_208;
  uVar6 = Uint128Low64(v_00);
  std::ostream::operator<<(&stack0xfffffffffffffe38,uVar6);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe38);
  return __return_storage_ptr__;
}

Assistant:

std::string Uint128ToFormattedString(uint128 v, std::ios_base::fmtflags flags) {
  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  int div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div = 0x1000000000000000;  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = 01000000000000000000000;  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = 10000000000000000000u;  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of the
  // original value, each less than "div" and therefore representable as a
  // uint64_t.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = v;
  uint128 low;
  DivModImpl(high, div, &high, &low);
  uint128 mid;
  DivModImpl(high, div, &high, &mid);
  if (Uint128Low64(high) != 0) {
    os << Uint128Low64(high);
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << Uint128Low64(mid);
    os << std::setw(div_base_log);
  } else if (Uint128Low64(mid) != 0) {
    os << Uint128Low64(mid);
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << Uint128Low64(low);
  return os.str();
}